

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *pppOVar1;
  pointer puVar2;
  pointer pcVar3;
  pointer psVar4;
  iterator __position;
  pointer pbVar5;
  size_type sVar6;
  bool bVar7;
  uint uVar8;
  App *pAVar9;
  ExtrasError *this_00;
  int iVar10;
  int iVar11;
  pointer pbVar12;
  pointer puVar13;
  pointer psVar14;
  Option *this_01;
  int iVar15;
  int iVar16;
  uint uVar17;
  string pos;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  puVar13 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar2) {
    do {
      this_01 = (puVar13->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((this_01->pname_)._M_string_length != 0) {
        iVar11 = this_01->type_size_;
        iVar15 = this_01->expected_;
        iVar10 = (int)((ulong)((long)*(pointer *)
                                      ((long)&(this_01->results_).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      + 8) -
                              *(long *)&(this_01->results_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data) >> 5);
        if ((this_01->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) {
          iVar16 = iVar15 * iVar11;
          uVar8 = iVar11 >> 0x1f | 1;
          uVar17 = 1;
          if (iVar15 < 0) {
            uVar17 = uVar8;
          }
          iVar11 = -iVar16;
          if (0 < iVar16) {
            iVar11 = iVar16;
          }
          if ((int)(uVar17 * iVar11) <= iVar10) {
            if (-1 < iVar15) {
              uVar8 = 1;
            }
            goto LAB_00144c82;
          }
        }
        else {
          iVar15 = iVar15 * iVar11;
          iVar11 = -iVar15;
          if (0 < iVar15) {
            iVar11 = iVar15;
          }
          uVar8 = 0xffffffff;
          if (-iVar11 <= iVar10) {
LAB_00144c82:
            if (-1 < (int)(iVar11 * uVar8)) goto LAB_00144d08;
          }
        }
        if (this->validate_positionals_ != true) {
LAB_00144e83:
          pcVar3 = pbVar12[-1]._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + pbVar12[-1]._M_string_length);
          Option::_add_result(this_01,&local_70);
          this_01->callback_run_ = false;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          local_a8._M_dataplus._M_p =
               (pointer)(puVar13->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          __position._M_current =
               (this->parse_order_).
               super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::
            _M_realloc_insert<CLI::Option*>
                      ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                       __position,(Option **)&local_a8);
          }
          else {
            *__position._M_current = (Option *)local_a8._M_dataplus._M_p;
            pppOVar1 = &(this->parse_order_).
                        super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppOVar1 = *pppOVar1 + 1;
          }
          pbVar12 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar12 + -1;
          pcVar3 = pbVar12[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar12[-1].field_2) {
            operator_delete(pcVar3);
            return true;
          }
          return true;
        }
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar3 = pbVar12[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar3,pcVar3 + pbVar12[-1]._M_string_length);
        Option::_validate(&local_50,
                          (puVar13->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_a8);
        ::std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        sVar6 = local_a8._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (sVar6 == 0) {
          this_01 = (puVar13->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          goto LAB_00144e83;
        }
      }
LAB_00144d08:
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar2);
  }
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar14 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4; psVar14 = psVar14 + 1
      ) {
    pAVar9 = (psVar14->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar9->name_)._M_string_length == 0) && (pAVar9->disabled_ == false)) &&
       (bVar7 = _parse_positional(pAVar9,args), bVar7)) {
      pAVar9 = (psVar14->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pAVar9->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar9,(long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
        return true;
      }
      return true;
    }
  }
  if ((this->parent_ != (App *)0x0) && (this->fallthrough_ == true)) {
    pAVar9 = _get_fallthrough_parent(this);
    bVar7 = _parse_positional(pAVar9,args);
    return bVar7;
  }
  pAVar9 = _find_subcommand(this,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if ((pAVar9 != (App *)0x0) &&
     ((this->require_subcommand_max_ == 0 ||
      ((ulong)((long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) < this->require_subcommand_max_)))) {
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar12 + -1;
    pcVar3 = pbVar12[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar12[-1].field_2) {
      operator_delete(pcVar3);
    }
    _parse(pAVar9,args);
    return true;
  }
  pAVar9 = this;
  if (this->parent_ != (App *)0x0) {
    pAVar9 = _get_fallthrough_parent(this);
  }
  pAVar9 = _find_subcommand(pAVar9,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if (pAVar9 != (App *)0x0) {
    pAVar9 = pAVar9->parent_;
    if (pAVar9->require_subcommand_max_ == 0) {
      return false;
    }
    if ((ulong)((long)(pAVar9->parsed_subcommands_).
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pAVar9->parsed_subcommands_).
                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) < pAVar9->require_subcommand_max_) {
      return false;
    }
  }
  if (this->positionals_at_end_ == true) {
    this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,args);
    ExtrasError::ExtrasError(this_00,&local_88);
    __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
  }
  if ((this->parent_ != (App *)0x0) && ((this->name_)._M_string_length == 0)) {
    return false;
  }
  _move_to_missing(this,NONE,pbVar12 + -1);
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar12 + -1;
  pcVar3 = pbVar12[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar12[-1].field_2) {
    operator_delete(pcVar3);
  }
  if (this->prefix_command_ == true) {
    do {
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if ((args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar12) {
          return true;
        }
        _move_to_missing(this,NONE,pbVar12 + -1);
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pbVar12 = pbVar5 + -1;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar12;
        pcVar3 = pbVar5[-1]._M_dataplus._M_p;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar3 == &pbVar5[-1].field_2);
      operator_delete(pcVar3);
    } while( true );
  }
  return true;
}

Assistant:

bool _parse_positional(std::vector<std::string> &args) {

        const std::string &positional = args.back();
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected() || opt->get_items_expected() < 0)) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return true;
            }
        }

        for(auto &subc : subcommands_) {
            if((subc->name_.empty()) && (!subc->disabled_)) {
                if(subc->_parse_positional(args)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        // let the parent deal with it if possible
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_positional(args);

        /// Try to find a local subcommand that is repeated
        auto com = _find_subcommand(args.back(), true, false);
        if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
            args.pop_back();
            com->_parse(args);
            return true;
        }
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }

        if(positionals_at_end_) {
            throw CLI::ExtrasError(args);
        }
        /// If this is an option group don't deal with it
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }
        /// We are out of other options this goes to missing
        _move_to_missing(detail::Classifier::NONE, positional);
        args.pop_back();
        if(prefix_command_) {
            while(!args.empty()) {
                _move_to_missing(detail::Classifier::NONE, args.back());
                args.pop_back();
            }
        }

        return true;
    }